

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O0

pool_ptr<soul::AST::ProcessorBase> __thiscall
soul::ASTUtilities::scanForProcessorToUseAsMain(ASTUtilities *this,ModuleBase *module)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pool_ref<soul::AST::ModuleBase> *ppVar3;
  ProcessorBase *pPVar4;
  Property *pPVar5;
  ModuleBase *module_00;
  pool_ptr<soul::AST::ProcessorBase> local_78;
  pool_ptr<soul::AST::ProcessorBase> p2;
  pool_ptr<soul::AST::ProcessorBase> local_68;
  pool_ptr<soul::AST::ProcessorBase> p1;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ref<soul::AST::ModuleBase> *__end2;
  pool_ref<soul::AST::ModuleBase> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> local_38;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *local_28;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range2;
  ModuleBase *local_18;
  ModuleBase *module_local;
  pool_ptr<soul::AST::ProcessorBase> *lastProcessor;
  
  __range2._7_1_ = 0;
  local_18 = module;
  module_local = (ModuleBase *)this;
  pool_ptr<soul::AST::ProcessorBase>::pool_ptr((pool_ptr<soul::AST::ProcessorBase> *)this);
  iVar2 = (*(local_18->super_Scope)._vptr_Scope[0x11])(&local_18->super_Scope);
  local_38.s = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var,iVar2);
  local_28 = &local_38;
  __end2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin(local_28);
  ppVar3 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end(local_28);
  do {
    if (__end2 == ppVar3) {
      return (pool_ptr<soul::AST::ProcessorBase>)(ProcessorBase *)this;
    }
    p1.object = (ProcessorBase *)__end2;
    p2.object = (ProcessorBase *)__end2->object;
    cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>
              ((soul *)&local_68,(pool_ref<soul::AST::ModuleBase> *)&p2);
    pool_ref<soul::AST::ModuleBase>::~pool_ref((pool_ref<soul::AST::ModuleBase> *)&p2);
    bVar1 = pool_ptr<soul::AST::ProcessorBase>::operator!=(&local_68,(void *)0x0);
    if (bVar1) {
      pPVar4 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_68);
      bVar1 = AST::ProcessorBase::isSpecialisedInstance(pPVar4);
      if (bVar1) goto LAB_003c94fa;
      pPVar4 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_68);
      pPVar5 = AST::Annotation::findProperty<char[5]>(&pPVar4->annotation,(char (*) [5])"main");
      if (pPVar5 != (Property *)0x0) goto LAB_003c94fa;
      *(ProcessorBase **)this = local_68.object;
    }
    else {
LAB_003c94fa:
      module_00 = pool_ref::operator_cast_to_ModuleBase_((pool_ref *)p1.object);
      scanForProcessorToUseAsMain((ASTUtilities *)&local_78,module_00);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_78);
      if (bVar1) {
        *(ProcessorBase **)this = local_78.object;
      }
      pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_78);
    }
    pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_68);
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

static pool_ptr<AST::ProcessorBase> scanForProcessorToUseAsMain (AST::ModuleBase& module)
    {
        pool_ptr<AST::ProcessorBase> lastProcessor;

        for (auto& m : module.getSubModules())
        {
            auto p1 = cast<AST::ProcessorBase> (m);

            if (p1 != nullptr && ! p1->isSpecialisedInstance() && p1->annotation.findProperty ("main") == nullptr)
                lastProcessor = p1;
            else if (auto p2 = scanForProcessorToUseAsMain (m))
                lastProcessor = p2;
        }

        return lastProcessor;
    }